

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O1

Scal __thiscall LinearExpert<1,_1>::queryXafterZ(LinearExpert<1,_1> *this,X *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.array
          [0] - (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                m_storage.m_data.array[0];
  (this->dx).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0]
       = dVar1;
  dVar3 = (this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
          m_data.array[0] / (this->gamma + 1.0);
  dVar2 = exp(dVar1 * dVar1 * dVar3 * -0.5);
  this->rbf_x = dVar2;
  this->rbf_zx = this->rbf_z * dVar2;
  dVar1 = this->p_z_T;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar3 = dVar2 * dVar1 * dVar3;
  this->p_zx = dVar3;
  return dVar3;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryXafterZ( X const &x )
{
    dx = x - pred_x;

    X xInvVar = invPsi / (1.0 + gamma);

    rbf_x = exp(-0.5*dx.cwiseAbs2().dot(xInvVar));
    rbf_zx = rbf_z * rbf_x;
    p_zx = p_z_T * rbf_x * sqrt(xInvVar.prod());

    return p_zx;
}